

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeBlocksGenerator.cxx
# Opt level: O1

void __thiscall
Tree::BuildUnitImpl(Tree *this,cmXMLWriter *xml,string *virtualFolderPath,string *fsPath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  _Base_ptr p_Var3;
  size_type *psVar4;
  Tree *this_00;
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  Tree *local_68;
  string *local_60;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  p_Var3 = (this->files)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_68 = (Tree *)&(this->files)._M_t._M_impl.super__Rb_tree_header;
  local_60 = virtualFolderPath;
  local_58 = fsPath;
  if ((Tree *)p_Var3 != local_68) {
    paVar1 = &local_c8.field_2;
    do {
      local_c8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Unit","");
      cmXMLWriter::StartElement(xml,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_88,local_58,&this->path);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_88);
      psVar4 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_a8.field_2._M_allocated_capacity = *psVar4;
        local_a8.field_2._8_8_ = plVar2[3];
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      }
      else {
        local_a8.field_2._M_allocated_capacity = *psVar4;
        local_a8._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_a8._M_string_length = plVar2[1];
      *plVar2 = (long)psVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::_M_append((char *)&local_a8,*(ulong *)(p_Var3 + 1));
      psVar4 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_c8.field_2._M_allocated_capacity = *psVar4;
        local_c8.field_2._8_8_ = plVar2[3];
        local_c8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_c8.field_2._M_allocated_capacity = *psVar4;
        local_c8._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_c8._M_string_length = plVar2[1];
      *plVar2 = (long)psVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,"filename",&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      local_c8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"Option","");
      cmXMLWriter::StartElement(xml,&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      std::operator+(&local_88,"CMake Files\\",local_60);
      plVar2 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_88,(ulong)(this->path)._M_dataplus._M_p);
      psVar4 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_a8.field_2._M_allocated_capacity = *psVar4;
        local_a8.field_2._8_8_ = plVar2[3];
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
      }
      else {
        local_a8.field_2._M_allocated_capacity = *psVar4;
        local_a8._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_a8._M_string_length = plVar2[1];
      *plVar2 = (long)psVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_a8);
      psVar4 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_c8.field_2._M_allocated_capacity = *psVar4;
        local_c8.field_2._8_8_ = plVar2[3];
        local_c8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_c8.field_2._M_allocated_capacity = *psVar4;
        local_c8._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_c8._M_string_length = plVar2[1];
      *plVar2 = (long)psVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      cmXMLWriter::Attribute<std::__cxx11::string>(xml,"virtualFolder",&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != paVar1) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      cmXMLWriter::EndElement(xml);
      cmXMLWriter::EndElement(xml);
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((Tree *)p_Var3 != local_68);
  }
  this_00 = (this->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_68 = (this->folders).super__Vector_base<Tree,_std::allocator<Tree>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (this_00 != local_68) {
    do {
      std::operator+(&local_a8,local_60,&this->path);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_a8);
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      psVar4 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_c8.field_2._M_allocated_capacity = *psVar4;
        local_c8.field_2._8_8_ = plVar2[3];
      }
      else {
        local_c8.field_2._M_allocated_capacity = *psVar4;
        local_c8._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_c8._M_string_length = plVar2[1];
      *plVar2 = (long)psVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      std::operator+(&local_50,local_58,&this->path);
      plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
      psVar4 = (size_type *)(plVar2 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar2 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar4) {
        local_88.field_2._M_allocated_capacity = *psVar4;
        local_88.field_2._8_8_ = plVar2[3];
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      }
      else {
        local_88.field_2._M_allocated_capacity = *psVar4;
        local_88._M_dataplus._M_p = (pointer)*plVar2;
      }
      local_88._M_string_length = plVar2[1];
      *plVar2 = (long)psVar4;
      plVar2[1] = 0;
      *(undefined1 *)(plVar2 + 2) = 0;
      BuildUnitImpl(this_00,xml,&local_c8,&local_88);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      this_00 = this_00 + 1;
    } while (this_00 != local_68);
  }
  return;
}

Assistant:

void Tree::BuildUnitImpl(cmXMLWriter& xml,
                         const std::string& virtualFolderPath,
                         const std::string& fsPath) const
{
  for (std::string const& f : files) {
    xml.StartElement("Unit");
    xml.Attribute("filename", fsPath + path + "/" + f);

    xml.StartElement("Option");
    xml.Attribute("virtualFolder",
                  "CMake Files\\" + virtualFolderPath + path + "\\");
    xml.EndElement();

    xml.EndElement();
  }
  for (Tree const& folder : folders) {
    folder.BuildUnitImpl(xml, virtualFolderPath + path + "\\",
                         fsPath + path + "/");
  }
}